

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus
ZyanVectorFindEx(ZyanVector *vector,void *element,ZyanISize *found_index,
                ZyanEqualityComparison comparison,ZyanUSize index,ZyanUSize count)

{
  ZyanBool ZVar1;
  ulong local_48;
  ZyanUSize i;
  ZyanUSize count_local;
  ZyanUSize index_local;
  ZyanEqualityComparison comparison_local;
  ZyanISize *found_index_local;
  void *element_local;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    vector_local._4_4_ = 0x80100004;
  }
  else if ((vector->size < index + count) || (index == vector->size)) {
    vector_local._4_4_ = 0x80100008;
  }
  else if (count == 0) {
    *found_index = -1;
    vector_local._4_4_ = 0x100003;
  }
  else {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x29f,
                    "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                   );
    }
    local_48 = index;
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x2a0,
                    "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                   );
    }
    for (; local_48 < index + count; local_48 = local_48 + 1) {
      ZVar1 = (*comparison)((void *)((long)vector->data + local_48 * vector->element_size),element);
      if (ZVar1 != '\0') {
        *found_index = local_48;
        return 0x100002;
      }
    }
    *found_index = -1;
    vector_local._4_4_ = 0x100003;
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorFindEx(const ZyanVector* vector, const void* element, ZyanISize* found_index,
    ZyanEqualityComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index + count > vector->size) || (index == vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = -1;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    for (ZyanUSize i = index; i < index + count; ++i)
    {
        if (comparison(ZYCORE_VECTOR_OFFSET(vector, i), element))
        {
            *found_index = i;
            return ZYAN_STATUS_TRUE;
        }
    }

    *found_index = -1;
    return ZYAN_STATUS_FALSE;
}